

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionEval.cpp
# Opt level: O2

ExprBase * EvaluateUnaryOp(ExpressionEvalContext *ctx,ExprUnaryOp *expression)

{
  byte bVar1;
  Allocator *pAVar2;
  SynBase *pSVar3;
  TypeBase *pTVar4;
  ExpressionContext *pEVar5;
  TypeStruct *pTVar6;
  ExprPointerLiteral *pEVar7;
  bool bVar8;
  int iVar9;
  StackFrame **ppSVar10;
  undefined4 extraout_var;
  ExprMemoryLiteral *expression_00;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  TypeRef *type;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  ExprBase *pEVar11;
  _func_int **pp_Var12;
  char *msg;
  ExprMemoryLiteral *memory;
  ExprIntegerLiteral *expr;
  undefined4 uVar13;
  uint uVar14;
  longlong result;
  
  if (((ctx->stackFrames).count != 0) &&
     (ppSVar10 = SmallArray<ExpressionEvalContext::StackFrame_*,_32U>::back(&ctx->stackFrames),
     (*ppSVar10)->targetYield != 0)) {
    pAVar2 = ctx->ctx->allocator;
    iVar9 = (*pAVar2->_vptr_Allocator[2])(pAVar2,0x30);
    pEVar11 = (ExprBase *)CONCAT44(extraout_var,iVar9);
    pSVar3 = (expression->super_ExprBase).source;
    pTVar4 = ctx->ctx->typeVoid;
    pEVar11->typeID = 2;
    pEVar11->source = pSVar3;
    pEVar11->type = pTVar4;
    pEVar11->next = (ExprBase *)0x0;
    pEVar11->listed = false;
    pEVar11->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_003e3b40;
    return pEVar11;
  }
  bVar8 = AddInstruction(ctx);
  if ((!bVar8) ||
     (expression_00 = (ExprMemoryLiteral *)Evaluate(ctx,expression->value),
     expression_00 == (ExprMemoryLiteral *)0x0)) {
    return (ExprBase *)0x0;
  }
  pTVar4 = (expression_00->super_ExprBase).type;
  pEVar5 = ctx->ctx;
  if (pTVar4 == pEVar5->typeBool) {
    uVar14 = (expression_00->super_ExprBase).typeID;
    if (uVar14 == 6) {
      if (*(int *)&(expression->super_ExprBase).field_0x2c == 4) {
        iVar9 = (*pEVar5->allocator->_vptr_Allocator[2])(pEVar5->allocator,0x30);
        pEVar11 = (ExprBase *)CONCAT44(extraout_var_04,iVar9);
        pEVar7 = expression_00->ptr;
        pEVar11->typeID = 3;
        pTVar4 = (expression->super_ExprBase).type;
        pEVar11->source = (expression->super_ExprBase).source;
        pEVar11->type = pTVar4;
        pEVar11->listed = false;
        pEVar11->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_003e3360;
        pEVar11->field_0x29 = pEVar7 == (ExprPointerLiteral *)0x0;
        pEVar11->next = (ExprBase *)0x0;
        goto LAB_0022c183;
      }
    }
    else if ((uVar14 == 3) && (*(int *)&(expression->super_ExprBase).field_0x2c == 4)) {
      iVar9 = (*pEVar5->allocator->_vptr_Allocator[2])(pEVar5->allocator,0x30);
      pEVar11 = (ExprBase *)CONCAT44(extraout_var_01,iVar9);
      bVar1 = (expression_00->super_ExprBase).field_0x29;
      pEVar11->typeID = 3;
      pTVar4 = (expression->super_ExprBase).type;
      pEVar11->source = (expression->super_ExprBase).source;
      pEVar11->type = pTVar4;
      pEVar11->next = (ExprBase *)0x0;
      pEVar11->listed = false;
      pEVar11->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_003e3360;
      pEVar11->field_0x29 = bVar1 ^ 1;
LAB_0022c183:
      pEVar11 = CheckType(&expression->super_ExprBase,pEVar11);
      return pEVar11;
    }
  }
  else {
    bVar8 = ExpressionContext::IsIntegerType(pEVar5,pTVar4);
    if (bVar8) {
      result = 0;
      bVar8 = TryTakeLong((ExprBase *)expression_00,&result);
      if (bVar8) {
        switch(*(undefined4 *)&(expression->super_ExprBase).field_0x2c) {
        case 1:
          pAVar2 = ctx->ctx->allocator;
          iVar9 = (*pAVar2->_vptr_Allocator[2])(pAVar2,0x38);
          pEVar11 = (ExprBase *)CONCAT44(extraout_var_00,iVar9);
          pp_Var12 = (_func_int **)result;
          break;
        case 2:
          pAVar2 = ctx->ctx->allocator;
          iVar9 = (*pAVar2->_vptr_Allocator[2])(pAVar2,0x38);
          pEVar11 = (ExprBase *)CONCAT44(extraout_var_08,iVar9);
          pp_Var12 = (_func_int **)-result;
          break;
        case 3:
          pAVar2 = ctx->ctx->allocator;
          iVar9 = (*pAVar2->_vptr_Allocator[2])(pAVar2,0x38);
          pEVar11 = (ExprBase *)CONCAT44(extraout_var_06,iVar9);
          pp_Var12 = (_func_int **)~result;
          break;
        case 4:
          pAVar2 = ctx->ctx->allocator;
          iVar9 = (*pAVar2->_vptr_Allocator[2])(pAVar2,0x38);
          pEVar11 = (ExprBase *)CONCAT44(extraout_var_07,iVar9);
          pp_Var12 = (_func_int **)(ulong)(result == 0);
          break;
        default:
          __assert_fail("!\"unknown unary operation\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionEval.cpp"
                        ,0x57b,"ExprBase *EvaluateUnaryOp(ExpressionEvalContext &, ExprUnaryOp *)");
        }
        pEVar11->typeID = 6;
        pTVar4 = (expression->super_ExprBase).type;
        pEVar11->source = (expression->super_ExprBase).source;
        pEVar11->type = pTVar4;
        pEVar11->next = (ExprBase *)0x0;
        pEVar11->listed = false;
        pEVar11->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_003e33d0;
        pEVar11[1]._vptr_ExprBase = pp_Var12;
        goto LAB_0022c183;
      }
    }
    else {
      bVar8 = ExpressionContext::IsFloatingPointType(ctx->ctx,(expression_00->super_ExprBase).type);
      if (bVar8) {
        result = 0;
        bVar8 = TryTakeDouble((ExprBase *)expression_00,(double *)&result);
        if (bVar8) {
          iVar9 = *(int *)&(expression->super_ExprBase).field_0x2c;
          if (iVar9 - 3U < 2) {
            return (ExprBase *)0x0;
          }
          if (iVar9 == 2) {
            pAVar2 = ctx->ctx->allocator;
            iVar9 = (*pAVar2->_vptr_Allocator[2])(pAVar2,0x38);
            pEVar11 = (ExprBase *)CONCAT44(extraout_var_09,iVar9);
            uVar13 = (undefined4)result;
            uVar14 = (uint)((ulong)result >> 0x20) ^ 0x80000000;
          }
          else {
            if (iVar9 != 1) {
              __assert_fail("!\"unknown unary operation\"",
                            "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionEval.cpp"
                            ,0x58f,
                            "ExprBase *EvaluateUnaryOp(ExpressionEvalContext &, ExprUnaryOp *)");
            }
            pAVar2 = ctx->ctx->allocator;
            iVar9 = (*pAVar2->_vptr_Allocator[2])(pAVar2,0x38);
            pEVar11 = (ExprBase *)CONCAT44(extraout_var_02,iVar9);
            uVar13 = (undefined4)result;
            uVar14 = (uint)((ulong)result >> 0x20);
          }
          pEVar11->typeID = 7;
          pTVar4 = (expression->super_ExprBase).type;
          pEVar11->source = (expression->super_ExprBase).source;
          pEVar11->type = pTVar4;
          pEVar11->next = (ExprBase *)0x0;
          pEVar11->listed = false;
          pEVar11->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_003e3408;
          pEVar11[1]._vptr_ExprBase = (_func_int **)CONCAT44(uVar14,uVar13);
LAB_0022c1ed:
          pEVar11 = CheckType(&expression->super_ExprBase,pEVar11);
          return pEVar11;
        }
      }
      else {
        pTVar6 = (TypeStruct *)(expression_00->super_ExprBase).type;
        if ((pTVar6 == (TypeStruct *)0x0) || ((pTVar6->super_TypeBase).typeID != 0x12)) {
          pEVar5 = ctx->ctx;
          if (pTVar6 == pEVar5->typeAutoRef) {
            memory = (ExprMemoryLiteral *)0x0;
            if ((expression_00->super_ExprBase).typeID == 0xd) {
              memory = expression_00;
            }
            result = 0;
            type = ExpressionContext::GetReferenceType(pEVar5,pEVar5->typeVoid);
            pEVar11 = CreateExtract(ctx,memory,4,&type->super_TypeBase);
            bVar8 = TryTakePointer(pEVar11,(void **)&result);
            if (bVar8) {
              pAVar2 = ctx->ctx->allocator;
              iVar9 = (*pAVar2->_vptr_Allocator[2])(pAVar2,0x30);
              pEVar11 = (ExprBase *)CONCAT44(extraout_var_05,iVar9);
              pSVar3 = (expression->super_ExprBase).source;
              pTVar4 = ctx->ctx->typeBool;
              pEVar11->typeID = 3;
              pEVar11->source = pSVar3;
              pEVar11->type = pTVar4;
              pEVar11->listed = false;
              pEVar11->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_003e3360;
              pEVar11->field_0x29 = result == 0;
              pEVar11->next = (ExprBase *)0x0;
              goto LAB_0022c1ed;
            }
            msg = "ERROR: failed to evaluate auto ref value";
            goto LAB_0022c052;
          }
        }
        else {
          uVar14 = (expression_00->super_ExprBase).typeID;
          bVar8 = true;
          if (uVar14 != 9) {
            if (uVar14 != 0xc) {
              __assert_fail("!\"unknown type\"",
                            "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionEval.cpp"
                            ,0x59c,
                            "ExprBase *EvaluateUnaryOp(ExpressionEvalContext &, ExprUnaryOp *)");
            }
            bVar8 = expression_00->ptr == (ExprPointerLiteral *)0x0;
          }
          if (*(int *)&(expression->super_ExprBase).field_0x2c == 4) {
            pAVar2 = ctx->ctx->allocator;
            iVar9 = (*pAVar2->_vptr_Allocator[2])(pAVar2,0x30);
            pEVar11 = (ExprBase *)CONCAT44(extraout_var_03,iVar9);
            pSVar3 = (expression->super_ExprBase).source;
            pTVar4 = ctx->ctx->typeBool;
            pEVar11->typeID = 3;
            pEVar11->source = pSVar3;
            pEVar11->type = pTVar4;
            pEVar11->next = (ExprBase *)0x0;
            pEVar11->listed = false;
            pEVar11->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_003e3360;
            pEVar11->field_0x29 = bVar8;
            goto LAB_0022c183;
          }
        }
      }
    }
  }
  msg = "ERROR: failed to eval unary op";
LAB_0022c052:
  Report(ctx,msg);
  return (ExprBase *)0x0;
}

Assistant:

ExprBase* EvaluateUnaryOp(ExpressionEvalContext &ctx, ExprUnaryOp *expression)
{
	if(!ctx.stackFrames.empty() && ctx.stackFrames.back()->targetYield)
		return new (ctx.ctx.get<ExprVoid>()) ExprVoid(expression->source, ctx.ctx.typeVoid);

	if(!AddInstruction(ctx))
		return NULL;

	ExprBase *value = Evaluate(ctx, expression->value);

	if(!value)
		return NULL;

	if(value->type == ctx.ctx.typeBool)
	{
		if(ExprBoolLiteral *expr = getType<ExprBoolLiteral>(value))
		{
			if(expression->op == SYN_UNARY_OP_LOGICAL_NOT)
				return CheckType(expression, new (ctx.ctx.get<ExprBoolLiteral>()) ExprBoolLiteral(expression->source, expression->type, !expr->value));
		}
		else if(ExprIntegerLiteral *expr = getType<ExprIntegerLiteral>(value))
		{
			if(expression->op == SYN_UNARY_OP_LOGICAL_NOT)
				return CheckType(expression, new (ctx.ctx.get<ExprBoolLiteral>()) ExprBoolLiteral(expression->source, expression->type, !expr->value));
		}
	}
	else if(ctx.ctx.IsIntegerType(value->type))
	{
		long long result = 0;

		if(TryTakeLong(value, result))
		{
			switch(expression->op)
			{
			case SYN_UNARY_OP_PLUS:
				return CheckType(expression, new (ctx.ctx.get<ExprIntegerLiteral>()) ExprIntegerLiteral(expression->source, expression->type, result));
			case SYN_UNARY_OP_NEGATE:
				return CheckType(expression, new (ctx.ctx.get<ExprIntegerLiteral>()) ExprIntegerLiteral(expression->source, expression->type, -result));
			case SYN_UNARY_OP_BIT_NOT:
				return CheckType(expression, new (ctx.ctx.get<ExprIntegerLiteral>()) ExprIntegerLiteral(expression->source, expression->type, ~result));
			case SYN_UNARY_OP_LOGICAL_NOT:
				return CheckType(expression, new (ctx.ctx.get<ExprIntegerLiteral>()) ExprIntegerLiteral(expression->source, expression->type, !result));
			default:
				assert(!"unknown unary operation");
			}
		}
	}
	else if(ctx.ctx.IsFloatingPointType(value->type))
	{
		double result = 0.0;

		if(TryTakeDouble(value, result))
		{
			switch(expression->op)
			{
			case SYN_UNARY_OP_PLUS:
				return CheckType(expression, new (ctx.ctx.get<ExprRationalLiteral>()) ExprRationalLiteral(expression->source, expression->type, result));
			case SYN_UNARY_OP_NEGATE:
				return CheckType(expression, new (ctx.ctx.get<ExprRationalLiteral>()) ExprRationalLiteral(expression->source, expression->type, -result));
			case SYN_UNARY_OP_BIT_NOT:
			case SYN_UNARY_OP_LOGICAL_NOT:
				return NULL;
			default:
				assert(!"unknown unary operation");
			}
		}
	}
	else if(isType<TypeRef>(value->type))
	{
		void *lPtr = NULL;

		if(isType<ExprNullptrLiteral>(value))
			lPtr = NULL;
		else if(ExprPointerLiteral *tmp = getType<ExprPointerLiteral>(value))
			lPtr = tmp->ptr;
		else
			assert(!"unknown type");

		if(expression->op == SYN_UNARY_OP_LOGICAL_NOT)
			return CheckType(expression, new (ctx.ctx.get<ExprBoolLiteral>()) ExprBoolLiteral(expression->source, ctx.ctx.typeBool, !lPtr));
	}
	else if(value->type == ctx.ctx.typeAutoRef)
	{
		ExprMemoryLiteral *memLiteral = getType<ExprMemoryLiteral>(value);

		void *lPtr = 0;
		if(!TryTakePointer(CreateExtract(ctx, memLiteral, 4, ctx.ctx.GetReferenceType(ctx.ctx.typeVoid)), lPtr))
			return Report(ctx, "ERROR: failed to evaluate auto ref value");

		return CheckType(expression, new (ctx.ctx.get<ExprBoolLiteral>()) ExprBoolLiteral(expression->source, ctx.ctx.typeBool, !lPtr));

	}

	return Report(ctx, "ERROR: failed to eval unary op");
}